

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitvec * sqlite3BitvecCreate(u32 iSize)

{
  Bitvec *pBVar1;
  u32 in_EDI;
  Bitvec *p;
  u64 in_stack_fffffffffffffff0;
  
  pBVar1 = (Bitvec *)sqlite3MallocZero(in_stack_fffffffffffffff0);
  if (pBVar1 != (Bitvec *)0x0) {
    pBVar1->iSize = in_EDI;
  }
  return pBVar1;
}

Assistant:

SQLITE_PRIVATE Bitvec *sqlite3BitvecCreate(u32 iSize){
  Bitvec *p;
  assert( sizeof(*p)==BITVEC_SZ );
  p = sqlite3MallocZero( sizeof(*p) );
  if( p ){
    p->iSize = iSize;
  }
  return p;
}